

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateStackLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  bool bVar3;
  LayerUnion LVar4;
  LogMessage *pLVar5;
  long *plVar6;
  size_type *psVar7;
  string err;
  Result r;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c8 [8];
  _Alloc_hider local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  undefined1 local_a0 [8];
  _Alloc_hider local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88 [2];
  LogMessage local_68;
  
  Result::Result((Result *)local_c8);
  validateInputCount((Result *)local_a0,layer,2,-1);
  local_c8 = local_a0;
  std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_p != local_88) {
    operator_delete(local_98._M_p,local_88[0]._M_allocated_capacity + 1);
  }
  bVar3 = Result::good((Result *)local_c8);
  if (bVar3) {
    validateOutputCount((Result *)local_a0,layer,1,1);
    local_c8 = local_a0;
    std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_p != local_88) {
      operator_delete(local_98._M_p,local_88[0]._M_allocated_capacity + 1);
    }
  }
  if (layer->_oneof_case_[0] == 0x39d) {
    LVar4 = layer->layer_;
  }
  else {
    LVar4.stack_ = Specification::StackLayerParams::default_instance();
  }
  if ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) {
LAB_00550e44:
    __return_storage_ptr__->m_type = local_c8._0_4_;
    __return_storage_ptr__->m_reason = local_c8._4_4_;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_p == &local_b0) {
      paVar1->_M_allocated_capacity =
           CONCAT71(local_b0._M_allocated_capacity._1_7_,local_b0._M_local_buf[0]);
      *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_b0._8_8_;
    }
    else {
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_c0._M_p;
      (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
           CONCAT71(local_b0._M_allocated_capacity._1_7_,local_b0._M_local_buf[0]);
    }
    (__return_storage_ptr__->m_message)._M_string_length = local_b8;
    local_b8 = 0;
    local_b0._M_local_buf[0] = '\0';
    local_c0._M_p = (pointer)&local_b0;
  }
  else {
    if ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar5 = google::protobuf::internal::LogMessage::operator<<
                         (&local_68,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_a0,pLVar5);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    uVar2 = *(uint *)((long)((layer->inputtensor_).super_RepeatedPtrFieldBase.rep_)->elements[0] +
                     0x24);
    if ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 2) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar5 = google::protobuf::internal::LogMessage::operator<<
                         ((LogMessage *)local_a0,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_108,pLVar5);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_a0);
    }
    if (uVar2 == *(uint *)(*(long *)((layer->inputtensor_).super_RepeatedPtrFieldBase.rep_ + 1) +
                          0x24)) {
      if (((long)(int)~uVar2 <= (long)((LVar4.activation_)->NonlinearityType_).linear_) &&
         ((long)((LVar4.activation_)->NonlinearityType_).linear_ < (long)(int)uVar2 + 1))
      goto LAB_00550e44;
      std::operator+(&local_e8,
                     "Value of axis must be in the range [-rank(tensor), rank(tensor)] for \'",
                     (layer->name_).ptr_);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_e8);
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      psVar7 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_108.field_2._M_allocated_capacity = *psVar7;
        local_108.field_2._8_8_ = plVar6[3];
      }
      else {
        local_108.field_2._M_allocated_capacity = *psVar7;
        local_108._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_108._M_string_length = plVar6[1];
      *plVar6 = (long)psVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_108);
    }
    else {
      std::operator+(&local_e8,"Shapes of all inputs must match for \'",(layer->name_).ptr_);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_e8);
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      psVar7 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_108.field_2._M_allocated_capacity = *psVar7;
        local_108.field_2._8_8_ = plVar6[3];
      }
      else {
        local_108.field_2._M_allocated_capacity = *psVar7;
        local_108._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_108._M_string_length = plVar6[1];
      *plVar6 = (long)psVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_108);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_p != &local_b0) {
    operator_delete(local_c0._M_p,
                    CONCAT71(local_b0._M_allocated_capacity._1_7_,local_b0._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateStackLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 2, -1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    const auto& params = layer.stack();
    if (layer.inputtensor_size() > 0) {
        const int rank0 = static_cast<int>(layer.inputtensor(0).rank());
        const int rank1 = static_cast<int>(layer.inputtensor(1).rank());
        if (rank0 != rank1) {
            const std::string err = "Shapes of all inputs must match for '" + layer.name() + "' layer.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        if (!(params.axis() >= -(rank0 + 1) && params.axis() < rank0 + 1)) {
            const std::string err = "Value of axis must be in the range [-rank(tensor), rank(tensor)] for '" + layer.name() + "' layer.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return r;
}